

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_filter.cpp
# Opt level: O2

bool __thiscall
duckdb::ExpressionFilter::EvaluateWithConstant
          (ExpressionFilter *this,ClientContext *context,Value *val)

{
  bool bVar1;
  type expression;
  ExpressionExecutor *this_00;
  ExpressionExecutor executor;
  ExpressionExecutor local_60;
  
  expression = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&this->expr);
  this_00 = &local_60;
  ExpressionExecutor::ExpressionExecutor(&local_60,context,expression);
  bVar1 = EvaluateWithConstant((ExpressionFilter *)this_00,&local_60,val);
  ExpressionExecutor::~ExpressionExecutor(&local_60);
  return bVar1;
}

Assistant:

bool ExpressionFilter::EvaluateWithConstant(ClientContext &context, const Value &val) {
	ExpressionExecutor executor(context, *expr);
	return EvaluateWithConstant(executor, val);
}